

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

void qpdf_force_pdf_version_and_extension(qpdf_data qpdf,char *version,int extension_level)

{
  QPDFWriter *this;
  allocator<char> local_39;
  string local_38;
  
  this = (qpdf->qpdf_writer).super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,version,&local_39);
  QPDFWriter::forcePDFVersion(this,&local_38,extension_level);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void
qpdf_force_pdf_version_and_extension(qpdf_data qpdf, char const* version, int extension_level)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_force_pdf_version");
    qpdf->qpdf_writer->forcePDFVersion(version, extension_level);
}